

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mappeablebloomfilter.h
# Opt level: O3

bool __thiscall MappeableBloomFilter<12>::Contain(MappeableBloomFilter<12> *this,uint64_t key)

{
  int iVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  int iVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  
  iVar1 = this->k;
  if (iVar1 < 1) {
    return true;
  }
  uVar8 = key + (this->hasher).seed;
  uVar8 = (uVar8 >> 0x21 ^ uVar8) * -0xae502812aa7333;
  uVar8 = (uVar8 >> 0x21 ^ uVar8) * -0x3b314601e57a13ad;
  uVar9 = uVar8 >> 0x21 ^ uVar8;
  uVar10 = uVar9 << 0x20 | uVar8 >> 0x20;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = this->arrayLength;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = uVar10;
  if ((this->data[SUB168(auVar2 * auVar4,8)] >> (uVar8 >> 0x20 & 0x3f) & 1) == 0) {
    return false;
  }
  iVar6 = 1;
  do {
    iVar7 = iVar6;
    uVar10 = uVar10 + uVar9;
    if (iVar1 == iVar7) break;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = this->arrayLength;
    auVar5._8_8_ = 0;
    auVar5._0_8_ = uVar10;
    iVar6 = iVar7 + 1;
  } while ((this->data[SUB168(auVar3 * auVar5,8)] >> (uVar10 & 0x3f) & 1) != 0);
  return iVar1 <= iVar7;
}

Assistant:

bool Contain(const uint64_t key) const {
    uint64_t hash = hasher(key);
    uint64_t a = (hash >> 32) | (hash << 32);;
    uint64_t b = hash;
    for (int i = 0; i < k; i++) {
      if ((data[fastrangesize(a, this->arrayLength)] & getBit(a)) == 0) {
        return false;
      }
      a += b;
    }
    return true;
  }